

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O1

void __thiscall t_d_generator::init_generator(t_d_generator *this)

{
  ofstream_with_content_based_conditional_update *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  t_program *ptVar2;
  pointer pptVar3;
  t_d_generator *this_01;
  int iVar4;
  int *piVar5;
  long lVar6;
  undefined8 *puVar7;
  long *plVar8;
  ostream *poVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  char *pcVar11;
  size_type *psVar12;
  pointer pptVar13;
  undefined8 uVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string f_types_name;
  string dir;
  string subdir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  string local_a0;
  char *local_80;
  long local_78;
  char local_70 [16];
  t_d_generator *local_60;
  t_program *local_58;
  string local_50;
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_c0,this);
  iVar4 = mkdir(local_c0._M_dataplus._M_p,0x1ff);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (iVar4 == -1) {
    piVar5 = __errno_location();
    if (*piVar5 != 0x11) {
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __cxa_allocate_exception(0x20);
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_e0,this);
      std::__cxx11::string::string
                ((string *)&local_80,local_e0._M_dataplus._M_p,(allocator *)&local_100);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_80);
      local_c0._M_dataplus._M_p = (pointer)*plVar8;
      psVar12 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_c0._M_dataplus._M_p == psVar12) {
        local_c0.field_2._M_allocated_capacity = *psVar12;
        local_c0.field_2._8_8_ = plVar8[3];
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      }
      else {
        local_c0.field_2._M_allocated_capacity = *psVar12;
      }
      local_c0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      pcVar11 = strerror(*piVar5);
      std::operator+(pbVar10,&local_c0,pcVar11);
      __cxa_throw(pbVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  ptVar2 = (this->super_t_oop_generator).super_t_generator.program_;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"d","");
  t_program::get_namespace(&local_c0,ptVar2,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_60 = this;
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_80,this);
  lVar6 = std::__cxx11::string::find((char *)&local_c0,0x3a9598,0);
  if (lVar6 != -1) {
    paVar1 = &local_e0.field_2;
    do {
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_100,local_80,local_80 + local_78);
      std::__cxx11::string::append((char *)&local_100);
      std::__cxx11::string::substr((ulong)&local_a0,(ulong)&local_c0);
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        uVar14 = local_100.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_a0._M_string_length + local_100._M_string_length) {
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          uVar14 = local_a0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_a0._M_string_length + local_100._M_string_length)
        goto LAB_001abf27;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_a0,0,(char *)0x0,(ulong)local_100._M_dataplus._M_p);
      }
      else {
LAB_001abf27:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_100,(ulong)local_a0._M_dataplus._M_p);
      }
      psVar12 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_e0.field_2._M_allocated_capacity = *psVar12;
        local_e0.field_2._8_8_ = puVar7[3];
        local_e0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_e0.field_2._M_allocated_capacity = *psVar12;
        local_e0._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_e0._M_string_length = puVar7[1];
      *puVar7 = psVar12;
      puVar7[1] = 0;
      *(undefined1 *)psVar12 = 0;
      std::__cxx11::string::operator=((string *)&local_80,(string *)&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      iVar4 = mkdir(local_80,0x1ff);
      if (iVar4 == -1) {
        piVar5 = __errno_location();
        if (*piVar5 != 0x11) {
          pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __cxa_allocate_exception(0x20);
          std::__cxx11::string::string((string *)&local_100,local_80,(allocator *)&local_a0);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_100);
          local_e0._M_dataplus._M_p = (pointer)*plVar8;
          psVar12 = (size_type *)(plVar8 + 2);
          if ((size_type *)local_e0._M_dataplus._M_p == psVar12) {
            local_e0.field_2._M_allocated_capacity = *psVar12;
            local_e0.field_2._8_8_ = plVar8[3];
            local_e0._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_e0.field_2._M_allocated_capacity = *psVar12;
          }
          local_e0._M_string_length = plVar8[1];
          *plVar8 = (long)psVar12;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          pcVar11 = strerror(*piVar5);
          std::operator+(pbVar10,&local_e0,pcVar11);
          __cxa_throw(pbVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
      }
      std::__cxx11::string::substr((ulong)&local_e0,(ulong)&local_c0);
      std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      lVar6 = std::__cxx11::string::find((char *)&local_c0,0x3a9598,0);
    } while (lVar6 != -1);
  }
  if (local_c0._M_string_length != 0) {
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_100,local_80,local_80 + local_78);
    std::__cxx11::string::append((char *)&local_100);
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_100,(ulong)local_c0._M_dataplus._M_p);
    paVar1 = &local_e0.field_2;
    psVar12 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_e0.field_2._M_allocated_capacity = *psVar12;
      local_e0.field_2._8_8_ = plVar8[3];
      local_e0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar12;
      local_e0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_e0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_80,(string *)&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    iVar4 = mkdir(local_80,0x1ff);
    if (iVar4 == -1) {
      piVar5 = __errno_location();
      if (*piVar5 != 0x11) {
        pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __cxa_allocate_exception(0x20);
        std::__cxx11::string::string((string *)&local_100,local_80,(allocator *)&local_a0);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_100);
        local_e0._M_dataplus._M_p = (pointer)*plVar8;
        psVar12 = (size_type *)(plVar8 + 2);
        if ((size_type *)local_e0._M_dataplus._M_p == psVar12) {
          local_e0.field_2._M_allocated_capacity = *psVar12;
          local_e0.field_2._8_8_ = plVar8[3];
          local_e0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_e0.field_2._M_allocated_capacity = *psVar12;
        }
        local_e0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        pcVar11 = strerror(*piVar5);
        std::operator+(pbVar10,&local_e0,pcVar11);
        __cxa_throw(pbVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
    }
  }
  paVar1 = &local_e0.field_2;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_e0,local_80,local_80 + local_78);
  this_01 = local_60;
  std::__cxx11::string::append((char *)&local_e0);
  std::__cxx11::string::operator=((string *)&this_01->package_dir_,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  std::operator+(&local_100,&this_01->package_dir_,
                 &(this_01->super_t_oop_generator).super_t_generator.program_name_);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_100);
  psVar12 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_e0.field_2._M_allocated_capacity = *psVar12;
    local_e0.field_2._8_8_ = plVar8[3];
    local_e0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar12;
    local_e0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_e0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  std::__cxx11::string::string
            ((string *)&local_100,local_e0._M_dataplus._M_p,(allocator *)&local_a0);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this_01->f_types_).super_ostringstream.
              super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  this_00 = &this_01->f_types_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            (this_00);
  (this_01->f_types_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
  field_0x90 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  (*(this_01->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_100,this_01);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_00,local_100._M_dataplus._M_p,local_100._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"module ",7);
  render_package_abi_cxx11_
            (&local_a0,this_01,(this_01->super_t_oop_generator).super_t_generator.program_);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(this_01->super_t_oop_generator).super_t_generator.program_name_.
                             _M_dataplus._M_p,
                      (this_01->super_t_oop_generator).super_t_generator.program_name_.
                      _M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_types;",7);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  print_default_imports(this_01,(ostream *)this_00);
  local_58 = (this_01->super_t_oop_generator).super_t_generator.program_;
  pptVar13 = (local_58->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  pptVar3 = (local_58->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (pptVar13 != pptVar3) {
    do {
      ptVar2 = *pptVar13;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"public import ",0xe);
      render_package_abi_cxx11_(&local_100,local_60,ptVar2);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)this_00,local_100._M_dataplus._M_p,local_100._M_string_length);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(ptVar2->name_)._M_dataplus._M_p,(ptVar2->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_types;",7);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      pptVar13 = pptVar13 + 1;
    } while (pptVar13 != pptVar3);
  }
  if ((local_58->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (local_58->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void init_generator() override {
    // Make output directory
    MKDIR(get_out_dir().c_str());

    string dir = program_->get_namespace("d");
    string subdir = get_out_dir();
    string::size_type loc;
    while ((loc = dir.find(".")) != string::npos) {
      subdir = subdir + "/" + dir.substr(0, loc);
      MKDIR(subdir.c_str());
      dir = dir.substr(loc + 1);
    }
    if (!dir.empty()) {
      subdir = subdir + "/" + dir;
      MKDIR(subdir.c_str());
    }

    package_dir_ = subdir + "/";

    // Make output file
    string f_types_name = package_dir_ + program_name_ + "_types.d";
    f_types_.open(f_types_name.c_str());

    // Print header
    f_types_ << autogen_comment() << "module " << render_package(*program_) << program_name_
             << "_types;" << endl << endl;

    print_default_imports(f_types_);

    // Include type modules from other imported programs.
    const vector<t_program*>& includes = program_->get_includes();
    for (auto include : includes) {
      f_types_ << "public import " << render_package(*include) << include->get_name()
               << "_types;" << endl;
    }
    if (!includes.empty())
      f_types_ << endl;
  }